

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O0

UBool icu_63::PatternProps::isSyntaxOrWhiteSpace(UChar32 c)

{
  bool local_15;
  uint32_t bits;
  UChar32 c_local;
  
  if (c < 0) {
    bits._3_1_ = false;
  }
  else if (c < 0x100) {
    bits._3_1_ = (bool)(latin1[c] & 1);
  }
  else if (c < 0x200e) {
    bits._3_1_ = false;
  }
  else if (c < 0x3031) {
    bits._3_1_ = (bool)((byte)(*(uint *)(syntaxOrWhiteSpace2000 +
                                        (ulong)(byte)index2000[c + -0x2000 >> 5] * 4) >>
                              ((byte)c & 0x1f)) & 1);
  }
  else if ((c < 0xfd3e) || (0xfe46 < c)) {
    bits._3_1_ = false;
  }
  else {
    local_15 = c < 0xfd40 || 0xfe44 < c;
    bits._3_1_ = local_15;
  }
  return bits._3_1_;
}

Assistant:

UBool
PatternProps::isSyntaxOrWhiteSpace(UChar32 c) {
    if(c<0) {
        return FALSE;
    } else if(c<=0xff) {
        return (UBool)(latin1[c]&1);
    } else if(c<0x200e) {
        return FALSE;
    } else if(c<=0x3030) {
        uint32_t bits=syntaxOrWhiteSpace2000[index2000[(c-0x2000)>>5]];
        return (UBool)((bits>>(c&0x1f))&1);
    } else if(0xfd3e<=c && c<=0xfe46) {
        return c<=0xfd3f || 0xfe45<=c;
    } else {
        return FALSE;
    }
}